

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_check_zero_element(TCGContext_conflict6 *tcg_ctx,TCGv_i64 tresult,uint8_t df,uint8_t wt)

{
  int64_t arg2;
  int64_t arg2_00;
  TCGTemp *a1;
  TCGTemp *a3;
  undefined7 in_register_00000009;
  ulong uVar1;
  uintptr_t o_2;
  TCGv_i64 ret;
  uintptr_t o_1;
  TCGv_i64 ret_00;
  
  a1 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)a1 - (long)tcg_ctx);
  a3 = tcg_temp_new_internal_mips64el(tcg_ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a3 - (long)tcg_ctx);
  arg2 = *(int64_t *)(&DAT_00d89440 + (long)(char)df * 8);
  arg2_00 = *(int64_t *)(&DAT_00d89460 + (long)(char)df * 8);
  uVar1 = (ulong)(uint)((int)CONCAT71(in_register_00000009,wt) << 4);
  tcg_gen_subi_i64_mips64el(tcg_ctx,ret_00,*(TCGv_i64 *)((long)tcg_ctx->msa_wr_d + uVar1),arg2_00);
  tcg_gen_andc_i64_mips64el(tcg_ctx,ret_00,ret_00,*(TCGv_i64 *)((long)tcg_ctx->msa_wr_d + uVar1));
  tcg_gen_andi_i64_mips64el(tcg_ctx,ret_00,ret_00,arg2);
  tcg_gen_subi_i64_mips64el(tcg_ctx,ret,*(TCGv_i64 *)((long)tcg_ctx->msa_wr_d + uVar1 + 8),arg2_00);
  tcg_gen_andc_i64_mips64el(tcg_ctx,ret,ret,*(TCGv_i64 *)((long)tcg_ctx->msa_wr_d + uVar1 + 8));
  tcg_gen_andi_i64_mips64el(tcg_ctx,ret,ret,arg2);
  tcg_gen_op3_mips64el(tcg_ctx,INDEX_op_or_i64,(TCGArg)a1,(TCGArg)a1,(TCGArg)a3);
  tcg_gen_setcondi_i64_mips64el(tcg_ctx,TCG_COND_NE,ret_00,ret_00,0);
  if (ret_00 != tresult) {
    tcg_gen_op2_mips64el(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tresult + (long)tcg_ctx),(TCGArg)a1);
  }
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_check_zero_element(TCGContext *tcg_ctx, TCGv tresult, uint8_t df, uint8_t wt)
{
    /* generates tcg ops to check if any element is 0 */
    /* Note this function only works with MSA_WRLEN = 128 */
    uint64_t eval_zero_or_big = 0;
    uint64_t eval_big = 0;
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    switch (df) {
    case DF_BYTE:
        eval_zero_or_big = 0x0101010101010101ULL;
        eval_big = 0x8080808080808080ULL;
        break;
    case DF_HALF:
        eval_zero_or_big = 0x0001000100010001ULL;
        eval_big = 0x8000800080008000ULL;
        break;
    case DF_WORD:
        eval_zero_or_big = 0x0000000100000001ULL;
        eval_big = 0x8000000080000000ULL;
        break;
    case DF_DOUBLE:
        eval_zero_or_big = 0x0000000000000001ULL;
        eval_big = 0x8000000000000000ULL;
        break;
    }
    tcg_gen_subi_i64(tcg_ctx, t0, tcg_ctx->msa_wr_d[wt << 1], eval_zero_or_big);
    tcg_gen_andc_i64(tcg_ctx, t0, t0, tcg_ctx->msa_wr_d[wt << 1]);
    tcg_gen_andi_i64(tcg_ctx, t0, t0, eval_big);
    tcg_gen_subi_i64(tcg_ctx, t1, tcg_ctx->msa_wr_d[(wt << 1) + 1], eval_zero_or_big);
    tcg_gen_andc_i64(tcg_ctx, t1, t1, tcg_ctx->msa_wr_d[(wt << 1) + 1]);
    tcg_gen_andi_i64(tcg_ctx, t1, t1, eval_big);
    tcg_gen_or_i64(tcg_ctx, t0, t0, t1);
    /* if all bits are zero then all elements are not zero */
    /* if some bit is non-zero then some element is zero */
    tcg_gen_setcondi_i64(tcg_ctx, TCG_COND_NE, t0, t0, 0);
    tcg_gen_trunc_i64_tl(tcg_ctx, tresult, t0);
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}